

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_load_srsgpr(TCGContext_conflict6 *tcg_ctx,int from,int to)

{
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  TCGv_ptr r;
  TCGv_ptr addr;
  TCGv_i32 t2;
  TCGv_i64 t0;
  int to_local;
  int from_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  if (from == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,0);
  }
  else {
    ret_00 = tcg_temp_new_i32(tcg_ctx);
    r = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx,ret_00,tcg_ctx->cpu_env,0x694);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,ret_00,6);
    tcg_gen_andi_i32_mips64el(tcg_ctx,ret_00,ret_00,0xf);
    tcg_gen_muli_i32_mips64el(tcg_ctx,ret_00,ret_00,0x100);
    tcg_gen_ext_i32_ptr(tcg_ctx,r,ret_00);
    tcg_gen_add_ptr(tcg_ctx,r,tcg_ctx->cpu_env,r);
    tcg_gen_ld_i64_mips64el(tcg_ctx,ret,r,(long)from << 3);
    tcg_temp_free_ptr(tcg_ctx,r);
    tcg_temp_free_i32(tcg_ctx,ret_00);
  }
  gen_store_gpr(tcg_ctx,ret,to);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

static inline void gen_load_srsgpr(TCGContext *tcg_ctx, int from, int to)
{
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (from == 0) {
        tcg_gen_movi_tl(tcg_ctx, t0, 0);
    } else {
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_ptr addr = tcg_temp_new_ptr(tcg_ctx);

        tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SRSCtl));
        tcg_gen_shri_i32(tcg_ctx, t2, t2, CP0SRSCtl_PSS);
        tcg_gen_andi_i32(tcg_ctx, t2, t2, 0xf);
        tcg_gen_muli_i32(tcg_ctx, t2, t2, sizeof(target_ulong) * 32);
        tcg_gen_ext_i32_ptr(tcg_ctx, addr, t2);
        tcg_gen_add_ptr(tcg_ctx, addr, tcg_ctx->cpu_env, addr);

        tcg_gen_ld_tl(tcg_ctx, t0, addr, sizeof(target_ulong) * from);
        tcg_temp_free_ptr(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    gen_store_gpr(tcg_ctx, t0, to);
    tcg_temp_free(tcg_ctx, t0);
}